

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::~BatchedMatMulLayerParams
          (BatchedMatMulLayerParams *this)

{
  ~BatchedMatMulLayerParams(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

BatchedMatMulLayerParams::~BatchedMatMulLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BatchedMatMulLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}